

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record_file.c
# Opt level: O2

int recordCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  ring_buffer_size_t rVar1;
  long elementCount;
  
  rVar1 = PaUtil_GetRingBufferWriteAvailable((PaUtilRingBuffer *)((long)userData + 0x10));
  elementCount = framesPerBuffer * 2;
  if (SBORROW8(rVar1,framesPerBuffer * 2) != (long)(rVar1 + framesPerBuffer * -2) < 0) {
    elementCount = rVar1;
  }
  rVar1 = PaUtil_WriteRingBuffer
                    ((PaUtilRingBuffer *)((long)userData + 0x10),inputBuffer,elementCount);
  *(int *)userData = *userData + (int)rVar1;
  return 0;
}

Assistant:

static int recordCallback( const void *inputBuffer, void *outputBuffer,
                           unsigned long framesPerBuffer,
                           const PaStreamCallbackTimeInfo* timeInfo,
                           PaStreamCallbackFlags statusFlags,
                           void *userData )
{
    paTestData *data = (paTestData*)userData;
    ring_buffer_size_t elementsWriteable = PaUtil_GetRingBufferWriteAvailable(&data->ringBuffer);
    ring_buffer_size_t elementsToWrite = min(elementsWriteable, (ring_buffer_size_t)(framesPerBuffer * NUM_CHANNELS));
    const SAMPLE *rptr = (const SAMPLE*)inputBuffer;

    (void) outputBuffer; /* Prevent unused variable warnings. */
    (void) timeInfo;
    (void) statusFlags;
    (void) userData;

    data->frameIndex += PaUtil_WriteRingBuffer(&data->ringBuffer, rptr, elementsToWrite);

    return paContinue;
}